

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestResult::Clear(TestResult *this)

{
  TestPartResult *__first;
  TestPartResult *__last;
  TestProperty *__first_00;
  TestProperty *__last_00;
  
  __first = (this->test_part_results_).
            super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __last = (this->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    std::_Destroy_aux<false>::__destroy<testing::TestPartResult*>(__first,__last);
    (this->test_part_results_).
    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = __first;
  }
  __first_00 = (this->test_properties_).
               super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>.
               _M_impl.super__Vector_impl_data._M_start;
  __last_00 = (this->test_properties_).
              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (__last_00 != __first_00) {
    std::_Destroy_aux<false>::__destroy<testing::TestProperty*>(__first_00,__last_00);
    (this->test_properties_).
    super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
    super__Vector_impl_data._M_finish = __first_00;
  }
  this->death_test_count_ = 0;
  this->elapsed_time_ = 0;
  return;
}

Assistant:

void TestResult::Clear() {
  test_part_results_.clear();
  test_properties_.clear();
  death_test_count_ = 0;
  elapsed_time_ = 0;
}